

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O3

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
jsoncons::
decode_traits<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,char,void>
::
decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,
          decode_traits<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,char,void>
          *this,basic_staj_cursor<char> *cursor,
          json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
          *decoder,error_code *ec)

{
  char *pcVar1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvVar2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_68;
  vector<double,_std::allocator<double>_> local_48;
  
  local_68.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*(long *)this + 0x10))(this,decoder);
  pvVar2 = __return_storage_ptr__;
  if (*(int *)&(decoder->super_basic_json_visitor<char>)._vptr_basic_json_visitor == 0) {
    pcVar1 = (char *)(**(code **)(*(long *)this + 0x20))(this);
    if (*pcVar1 == '\x0e') {
      (**(code **)(*(long *)this + 0x40))(this,decoder);
      while ((pcVar1 = (char *)(**(code **)(*(long *)this + 0x20))(this), *pcVar1 != '\x0f' &&
             (*(int *)&(decoder->super_basic_json_visitor<char>)._vptr_basic_json_visitor == 0))) {
        decode_traits<std::vector<double,std::allocator<double>>,char,void>::
        decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
                  (&local_48,
                   (decode_traits<std::vector<double,std::allocator<double>>,char,void> *)this,
                   cursor,decoder,ec);
        std::
        vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
        ::emplace_back<std::vector<double,std::allocator<double>>>
                  ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                    *)&local_68,&local_48);
        if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        if (*(int *)&(decoder->super_basic_json_visitor<char>)._vptr_basic_json_visitor != 0)
        goto LAB_0035128c;
        (**(code **)(*(long *)this + 0x40))(this,decoder);
      }
    }
    else {
      std::error_code::operator=((error_code *)decoder,not_vector);
    }
    (__return_storage_ptr__->
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         local_68.
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         local_68.
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_68.
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar2 = &local_68;
  }
LAB_0035128c:
  (pvVar2->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar2->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_68);
  return __return_storage_ptr__;
}

Assistant:

static T decode(basic_staj_cursor<CharT>& cursor, 
            json_decoder<Json,TempAllocator>& decoder, 
            std::error_code& ec)
        {
            T v;

            cursor.array_expected(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return T{};
            }
            if (cursor.current().event_type() != staj_event_type::begin_array)
            {
                ec = conv_errc::not_vector;
                return v;
            }
            cursor.next(ec);
            while (cursor.current().event_type() != staj_event_type::end_array && !ec)
            {
                v.push_back(decode_traits<value_type,CharT>::decode(cursor, decoder, ec));
                if (JSONCONS_UNLIKELY(ec)) {return T{};}
                //std::cout << "read next 10\n";
                cursor.next(ec);
            }
            return v;
        }